

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

PlayerInfo * __thiscall RenX::Server::getPlayerByPartName(Server *this,string_view partName)

{
  size_type sVar1;
  PlayerInfo *r;
  Server *this_local;
  string_view partName_local;
  
  sVar1 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                    (&this->players);
  if (sVar1 == 0) {
    partName_local._M_str = (char *)0x0;
  }
  else {
    partName_local._M_str = (char *)getPlayerByName(this,partName);
    if ((PlayerInfo *)partName_local._M_str == (PlayerInfo *)0x0) {
      partName_local._M_str = (char *)getPlayerByPartNameFast(this,partName);
    }
  }
  return (PlayerInfo *)partName_local._M_str;
}

Assistant:

RenX::PlayerInfo *RenX::Server::getPlayerByPartName(std::string_view partName) const {
	if (this->players.size() == 0)
		return nullptr;

	RenX::PlayerInfo *r = getPlayerByName(partName);
	if (r != nullptr)
		return r;

	return getPlayerByPartNameFast(partName);
}